

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::Clear(Message *message)

{
  pointer ppFVar1;
  Reflection *this;
  InternalMetadata *pIVar2;
  UnknownFieldSet *this_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  pointer ppFVar3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_38;
  
  this = GetReflectionOrDie(message);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields
            (this,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_38);
  ppFVar1 = local_38._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar3 = local_38._M_impl.super__Vector_impl_data._M_start; ppFVar3 != ppFVar1;
      ppFVar3 = ppFVar3 + 1) {
    Reflection::ClearField(this,message,*ppFVar3);
  }
  pIVar2 = Reflection::GetInternalMetadata(this,message);
  if ((pIVar2->ptr_ & 1) != 0) {
    this_00 = Reflection::MutableUnknownFields(this,message);
    UnknownFieldSet::Clear(this_00);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void ReflectionOps::Clear(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (const FieldDescriptor* field : fields) {
    reflection->ClearField(message, field);
  }

  if (reflection->GetInternalMetadata(*message).have_unknown_fields()) {
    reflection->MutableUnknownFields(message)->Clear();
  }
}